

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void __thiscall
kratos::AssignmentTypeBlockVisitor::visit
          (AssignmentTypeBlockVisitor *this,SequentialStmtBlock *block)

{
  pointer psVar1;
  int iVar2;
  Generator *pGVar3;
  shared_ptr<kratos::Attribute> *attr;
  pointer psVar4;
  undefined1 local_80 [8];
  AssignmentTypeVisitor visitor;
  
  pGVar3 = Stmt::generator_parent((Stmt *)block);
  if ((pGVar3 == (Generator *)0x0) ||
     (((pGVar3->is_cloned_ == false &&
       ((pGVar3->lib_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pGVar3->lib_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) && ((pGVar3->is_external_ & 1U) == 0)))) {
    psVar1 = *(pointer *)
              ((long)&(block->super_StmtBlock).super_Stmt.super_IRNode.attributes_.
                      super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    for (psVar4 = (block->super_StmtBlock).super_Stmt.super_IRNode.attributes_.
                  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1)
    {
      iVar2 = std::__cxx11::string::compare
                        ((char *)&((psVar4->
                                   super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->type_str);
      if ((iVar2 == 0) &&
         (iVar2 = std::__cxx11::string::compare
                            ((char *)&((psVar4->
                                       super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->value_str), iVar2 == 0)) {
        return;
      }
    }
    visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
    visitor.super_IRVisitor._8_8_ =
         &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
    visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
    visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
    local_80 = (undefined1  [8])&PTR_visit_root_002b1b48;
    visitor.super_IRVisitor.visited_._M_h._M_single_bucket._0_4_ = 1;
    visitor.super_IRVisitor.visited_._M_h._M_single_bucket._4_1_ = 1;
    IRVisitor::visit_root((IRVisitor *)local_80,(IRNode *)block);
    local_80 = (undefined1  [8])&PTR_visit_root_002ab320;
    std::
    _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&visitor.super_IRVisitor.level);
  }
  return;
}

Assistant:

void visit(SequentialStmtBlock* block) override {
        auto* parent = block->generator_parent();
        if (parent && (parent->is_cloned() || parent->external())) return;
        // attribute-based override
        auto const& attributes = block->get_attributes();
        for (auto const& attr : attributes) {
            if (attr->type_str == "check_assignment" && attr->value_str == "false") return;
        }
        AssignmentTypeVisitor visitor(AssignmentType::NonBlocking, true);
        visitor.visit_root(block->ast_node());
    }